

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  TValue *local_148;
  cTValue *local_140;
  cTValue *local_138;
  cTValue *local_130;
  cTValue *local_128;
  cTValue *mo2;
  uint32_t it;
  TValue *top;
  cTValue *mo;
  int ne_local;
  GCobj *o2_local;
  GCobj *o1_local;
  lua_State *L_local;
  
  if ((o1->th).base == (TValue *)0x0) {
    local_128 = (cTValue *)0x0;
  }
  else {
    if ((*(byte *)((long)(o1->th).base + 10) & 0x10) == 0) {
      local_130 = lj_meta_cache((GCtab *)&((o1->th).base)->gcr,MM_eq,
                                *(GCstr **)((L->glref).ptr64 + 0x1c8));
    }
    else {
      local_130 = (cTValue *)0x0;
    }
    local_128 = local_130;
  }
  if (local_128 == (cTValue *)0x0) {
    L_local = (lua_State *)(long)ne;
  }
  else {
    if ((o1->th).base != (o2->th).base) {
      if ((o2->th).base == (TValue *)0x0) {
        local_138 = (cTValue *)0x0;
      }
      else {
        if ((*(byte *)((long)(o2->th).base + 10) & 0x10) == 0) {
          local_140 = lj_meta_cache((GCtab *)&((o2->th).base)->gcr,MM_eq,
                                    *(GCstr **)((L->glref).ptr64 + 0x1c8));
        }
        else {
          local_140 = (cTValue *)0x0;
        }
        local_138 = local_140;
      }
      if ((local_138 == (cTValue *)0x0) || (iVar1 = lj_obj_equal(local_128,local_138), iVar1 == 0))
      {
        return (TValue *)(long)ne;
      }
    }
    if (*(char *)((L->base[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
      local_148 = L->base + (int)(uint)*(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) + 0x20
                                                          ) + -0x5d);
    }
    else {
      local_148 = L->top;
    }
    pcVar3 = lj_cont_condt;
    if (ne != 0) {
      pcVar3 = lj_cont_condf;
    }
    local_148->n = (lua_Number)pcVar3;
    local_148[1].u64 = 0xffffffffffffffff;
    local_148[2] = *local_128;
    L_local = (lua_State *)(local_148 + 4);
    local_148[3].u64 = 0xffffffffffffffff;
    uVar2 = (o1->gch).gct ^ 0xffffffff;
    *(ulong *)L_local = (ulong)o1 | (ulong)uVar2 << 0x2f;
    local_148[5].u64 = (ulong)o2 | (ulong)uVar2 << 0x2f;
  }
  return (TValue *)L_local;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top++, ne ? lj_cont_condf : lj_cont_condt);
    if (LJ_FR2) setnilV(top++);
    copyTV(L, top++, mo);
    if (LJ_FR2) setnilV(top++);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top, o1, it);
    setgcV(L, top+1, o2, it);
    return top;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}